

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_35::decode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  uint8_t uVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  wchar_t *pwVar5;
  wostream *pwVar6;
  conversion_result cVar7;
  gc_heap *h;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar8;
  uint *local_e40;
  wstring_view local_e18;
  string local_e08;
  wchar_t *local_df8;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_df0;
  const_iterator local_de8;
  wstring local_de0 [32];
  wstring_view local_dc0;
  wstring local_db0 [32];
  wostringstream local_d90 [8];
  wostringstream _woss_3;
  wostringstream local_c08 [8];
  wostringstream woss_3;
  wchar_t local_a88;
  uint len16;
  wchar_t buf16 [2];
  wstring_view local_a60;
  wstring local_a50 [32];
  wostringstream local_a30 [8];
  wostringstream _woss_2;
  wostringstream local_8a8 [8];
  wostringstream woss_2;
  uint local_730;
  char32_t cStack_72c;
  conversion_result conv;
  wstring_view local_708;
  wstring local_6f8 [32];
  wostringstream local_6d8 [8];
  wostringstream _woss_1;
  wostringstream local_550 [8];
  wostringstream woss_1;
  uint local_3d4;
  wstring local_3d0 [4];
  uint j;
  wstring_view local_3b0;
  wstring local_3a0 [32];
  wostringstream local_380 [8];
  wostringstream _woss;
  wostringstream local_1f8 [8];
  wostringstream woss;
  uint8_t local_7c [4];
  uint len;
  uint8_t buf [4];
  anon_class_24_3_e5424b64 get_byte;
  ulong local_50;
  size_t i;
  wstring res;
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  res.field_2._8_8_ = this;
  global_local = global;
  s_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)&i);
  local_50 = 0;
  while( true ) {
    while( true ) {
      sVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local);
      if (sVar3 <= local_50) {
        h = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)res.field_2._8_8_);
        local_e18 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&i);
        string::string(&local_e08,h,&local_e18);
        value::value(__return_storage_ptr__,&local_e08);
        string::~string(&local_e08);
        std::__cxx11::wstring::~wstring((wstring *)&i);
        return __return_storage_ptr__;
      }
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                          local_50);
      if (*pvVar4 == 0x25) break;
      pwVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                          local_50);
      std::__cxx11::wstring::operator+=((wstring *)&i,*pwVar5);
      local_50 = local_50 + 1;
    }
    _len = (wstring_view *)&global_local;
    local_7c[0] = decode_uri::anon_class_24_3_e5424b64::operator()((anon_class_24_3_e5424b64 *)&len)
    ;
    local_e40 = (uint *)((long)local_7c + 1);
    do {
      *(undefined1 *)local_e40 = 0;
      local_e40 = (uint *)((long)local_e40 + 1);
    } while (local_e40 != &len);
    uVar2 = unicode::utf8_length_from_lead_code_unit(local_7c[0]);
    if (uVar2 == 0) {
      std::__cxx11::wostringstream::wostringstream(local_1f8);
      pwVar6 = std::operator<<((wostream *)local_1f8,"Unsupported: ");
      bVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                         local_50,0xffffffffffffffff);
      std::operator<<(pwVar6,bVar8);
      std::__cxx11::wostringstream::wostringstream(local_380);
      pwVar6 = std::operator<<((wostream *)local_380,"Not implemented: ");
      std::__cxx11::wostringstream::str();
      std::operator<<(pwVar6,local_3a0);
      std::__cxx11::wstring::~wstring(local_3a0);
      std::__cxx11::wostringstream::str();
      local_3b0 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_3d0)
      ;
      throw_runtime_error(&local_3b0,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                          ,0xe9);
    }
    if (4 < uVar2) {
      __assert_fail("len <= sizeof(buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0xeb,
                    "value mjs::(anonymous namespace)::decode_uri(const gc_heap_ptr<global_object> &, const std::wstring_view)"
                   );
    }
    for (local_3d4 = 1; local_3d4 < uVar2; local_3d4 = local_3d4 + 1) {
      pvVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                          local_50);
      if (*pvVar4 != 0x25) {
        std::__cxx11::wostringstream::wostringstream(local_550);
        pwVar6 = std::operator<<((wostream *)local_550,"Unsupported: ");
        bVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                          ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                           local_50,0xffffffffffffffff);
        std::operator<<(pwVar6,bVar8);
        std::__cxx11::wostringstream::wostringstream(local_6d8);
        pwVar6 = std::operator<<((wostream *)local_6d8,"Not implemented: ");
        std::__cxx11::wostringstream::str();
        std::operator<<(pwVar6,local_6f8);
        std::__cxx11::wstring::~wstring(local_6f8);
        std::__cxx11::wostringstream::str();
        local_708 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&conv);
        throw_runtime_error(&local_708,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                            ,0xf0);
      }
      uVar1 = decode_uri::anon_class_24_3_e5424b64::operator()((anon_class_24_3_e5424b64 *)&len);
      local_7c[local_3d4] = uVar1;
    }
    cVar7 = unicode::utf8_to_utf32<unsigned_char>(local_7c,uVar2);
    local_730 = cVar7.length;
    if (local_730 != uVar2) {
      std::__cxx11::wostringstream::wostringstream(local_8a8);
      pwVar6 = std::operator<<((wostream *)local_8a8,"Unsupported: ");
      bVar8._M_str = (wchar_t *)s_local._M_len;
      bVar8._M_len = (size_t)global_local;
      std::operator<<(pwVar6,bVar8);
      std::__cxx11::wostringstream::wostringstream(local_a30);
      pwVar6 = std::operator<<((wostream *)local_a30,"Not implemented: ");
      std::__cxx11::wostringstream::str();
      std::operator<<(pwVar6,local_a50);
      std::__cxx11::wstring::~wstring(local_a50);
      std::__cxx11::wostringstream::str();
      local_a60 = (wstring_view)
                  std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)buf16);
      throw_runtime_error(&local_a60,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                          ,0xf8);
    }
    cStack_72c = cVar7.code_point;
    uVar2 = unicode::utf32_to_utf16<wchar_t>(cStack_72c,&local_a88);
    if (2 < uVar2) break;
    if (uVar2 == 0) {
      std::__cxx11::wostringstream::wostringstream(local_c08);
      pwVar6 = std::operator<<((wostream *)local_c08,"Unsupported: ");
      bVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&global_local,
                         local_50,0xffffffffffffffff);
      std::operator<<(pwVar6,bVar8);
      std::__cxx11::wostringstream::wostringstream(local_d90);
      pwVar6 = std::operator<<((wostream *)local_d90,"Not implemented: ");
      std::__cxx11::wostringstream::str();
      std::operator<<(pwVar6,local_db0);
      std::__cxx11::wstring::~wstring(local_db0);
      std::__cxx11::wostringstream::str();
      local_dc0 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_de0)
      ;
      throw_runtime_error(&local_dc0,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                          ,0x100);
    }
    local_df0._M_current = (wchar_t *)std::__cxx11::wstring::end();
    __gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>::__normal_iterator<wchar_t*>
              ((__normal_iterator<wchar_t_const*,std::__cxx11::wstring> *)&local_de8,&local_df0);
    local_df8 = (wchar_t *)
                std::__cxx11::wstring::insert<wchar_t*,void>
                          ((wstring *)&i,local_de8,&local_a88,&local_a88 + uVar2);
  }
  __assert_fail("len16 <= sizeof(buf16)/sizeof(*buf16)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                ,0xfc,
                "value mjs::(anonymous namespace)::decode_uri(const gc_heap_ptr<global_object> &, const std::wstring_view)"
               );
}

Assistant:

value decode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length();) {
        if (s[i] != '%') {
            res += s[i];
            ++i;
            continue;
        }
       auto get_byte = [&] () {
            assert(s[i] == '%');
            ++i;
            if (i + 2 > s.length()) {
                throw_uri_error(global);
            }
            i += 2;
            return static_cast<uint8_t>(get_hex_value2(&s[i-2]));
       };
       uint8_t buf[4] = { get_byte(), };
       const auto len = unicode::utf8_length_from_lead_code_unit(buf[0]);
       if (!len) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       assert(len <= sizeof(buf));
       for (unsigned j = 1; j < len; ++j) {
           if (s[i] != '%') {
               std::wostringstream woss;
               woss << "Unsupported: " << s.substr(i);
               NOT_IMPLEMENTED(woss.str());
           }
           buf[j] = get_byte();
       }
       auto conv = unicode::utf8_to_utf32(buf, len);
       if (conv.length != len) {
            std::wostringstream woss;
            woss << "Unsupported: " << s;
            NOT_IMPLEMENTED(woss.str());
        }
       wchar_t buf16[unicode::utf16_max_length];
       const auto len16 = unicode::utf32_to_utf16(conv.code_point, buf16);
       assert(len16 <= sizeof(buf16)/sizeof(*buf16));
       if (len16 == unicode::invalid_length) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       res.insert(res.end(), buf16, buf16 + len16);
    }
    return value{string{global.heap(), res}};
}